

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O2

string * __thiscall
deqp::egl::(anonymous_namespace)::configListToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Library *egl,
          EGLDisplay *display,vector<void_*,_std::allocator<void_*>_> *configs)

{
  undefined8 *puVar1;
  EGLint configId;
  EGLint local_54;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&local_50);
  for (puVar1 = (undefined8 *)*display; puVar1 != (undefined8 *)display[1]; puVar1 = puVar1 + 1) {
    local_54 = eglu::getConfigID((Library *)this,egl->_vptr_Library,(EGLConfig)*puVar1);
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    de::toString<int>(&local_50,&local_54);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string configListToString (const Library& egl, const EGLDisplay& display, const vector<EGLConfig>& configs)
{
	string str = "";
	for (vector<EGLConfig>::const_iterator cfgIter = configs.begin(); cfgIter != configs.end(); cfgIter++)
	{
		EGLConfig	config		= *cfgIter;
		EGLint		configId	= eglu::getConfigID(egl, display, config);

		if (str.length() != 0)
			str += " ";

		str += de::toString(configId);
	}
	return str;
}